

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void tlbimva_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  CPUState *cpu;
  _Bool _Var1;
  ulong addr;
  
  cpu = (CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14);
  addr = value & env->uc->init_target_page->mask;
  _Var1 = tlb_force_broadcast(env);
  if (_Var1) {
    tlb_flush_page_all_cpus_synced_aarch64(cpu,addr);
    return;
  }
  tlb_flush_page_aarch64(cpu,addr);
  return;
}

Assistant:

static void tlbimva_write(CPUARMState *env, const ARMCPRegInfo *ri,
                          uint64_t value)
{
    struct uc_struct *uc = env->uc;
    /* Invalidate single TLB entry by MVA and ASID (TLBIMVA) */
    CPUState *cs = env_cpu(env);

    value &= TARGET_PAGE_MASK;
    if (tlb_force_broadcast(env)) {
        tlb_flush_page_all_cpus_synced(cs, value);
    } else {
        tlb_flush_page(cs, value);
    }
}